

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall glcts::NegativeAPI::Run(NegativeAPI *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLenum GVar1;
  undefined8 in_RAX;
  long lVar2;
  GLint res;
  GLuint local_24;
  
  local_24 = (GLuint)((ulong)in_RAX >> 0x20);
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92dc,(GLint *)&local_24);
  buffers = &this->buffer;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,local_24,this->buffer);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x501) {
    lVar2 = 0;
  }
  else {
    glcts::anon_unknown_0::Output
              (
              "glBindBufferBase should generate INVALID_VALUE when index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n"
              );
    lVar2 = -1;
  }
  glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,local_24,*buffers,0,4);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 != 0x501) {
    glcts::anon_unknown_0::Output
              (
              "glBindBufferRange should generate INVALID_VALUE when index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n"
              );
    lVar2 = -1;
  }
  glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,local_24 - 1,*buffers,3,4);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 != 0x501) {
    glcts::anon_unknown_0::Output
              (
              "glBindBufferRange should generate INVALID_VALUE when <offset> is not a multiple of four\n"
              );
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		long  error = NO_ERROR;
		GLint res;
		glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &res);
		glGenBuffers(1, &buffer);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, res, buffer);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glBindBufferBase should generate INVALID_VALUE when"
				   " index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n");
			error = ERROR;
		}
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, res, buffer, 0, 4);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glBindBufferRange should generate INVALID_VALUE when"
				   " index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n");
			error = ERROR;
		}
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, res - 1, buffer, 3, 4);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glBindBufferRange should generate INVALID_VALUE when"
				   " <offset> is not a multiple of four\n");
			error = ERROR;
		}
		return error;
	}